

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH32_update(XXH32_state_t *state_in,void *input,size_t len)

{
  U32 UVar1;
  U32 UVar2;
  BYTE *pBVar3;
  XXH_endianess endian_detected;
  size_t len_local;
  void *input_local;
  XXH32_state_t *state_in_local;
  U32 v4_1;
  U32 v3_1;
  U32 v2_1;
  U32 v1_1;
  BYTE *limit_1;
  U32 *p32_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U32 local_260;
  U32 local_25c;
  U32 v4;
  U32 v3;
  U32 v2;
  U32 v1;
  BYTE *limit;
  U32 *p32;
  BYTE *bEnd;
  BYTE *p;
  
  pBVar3 = (BYTE *)((long)input + len);
  state_in->total_len_32 = (int)len + state_in->total_len_32;
  state_in->large_len = (uint)(0xf < len || 0xf < state_in->total_len_32) | state_in->large_len;
  if (state_in->memsize + len < 0x10) {
    XXH_memcpy((void *)((long)state_in->mem32 + (ulong)state_in->memsize),input,len);
    state_in->memsize = (int)len + state_in->memsize;
  }
  else {
    bEnd = (BYTE *)input;
    if (state_in->memsize != 0) {
      XXH_memcpy((void *)((long)state_in->mem32 + (ulong)state_in->memsize),input,
                 (ulong)(0x10 - state_in->memsize));
      UVar2 = state_in->v1;
      UVar1 = XXH_read32(state_in->mem32);
      UVar2 = XXH32_round(UVar2,UVar1);
      state_in->v1 = UVar2;
      UVar2 = state_in->v2;
      UVar1 = XXH_read32(state_in->mem32 + 1);
      UVar2 = XXH32_round(UVar2,UVar1);
      state_in->v2 = UVar2;
      UVar2 = state_in->v3;
      UVar1 = XXH_read32(state_in->mem32 + 2);
      UVar2 = XXH32_round(UVar2,UVar1);
      state_in->v3 = UVar2;
      UVar2 = state_in->v4;
      UVar1 = XXH_read32(state_in->mem32 + 3);
      UVar2 = XXH32_round(UVar2,UVar1);
      state_in->v4 = UVar2;
      bEnd = (BYTE *)((long)input + (ulong)(0x10 - state_in->memsize));
      state_in->memsize = 0;
    }
    if (bEnd <= pBVar3 + -0x10) {
      v3 = state_in->v1;
      v4 = state_in->v2;
      local_25c = state_in->v3;
      local_260 = state_in->v4;
      do {
        UVar2 = XXH_read32(bEnd);
        v3 = XXH32_round(v3,UVar2);
        UVar2 = XXH_read32(bEnd + 4);
        v4 = XXH32_round(v4,UVar2);
        UVar2 = XXH_read32(bEnd + 8);
        local_25c = XXH32_round(local_25c,UVar2);
        UVar2 = XXH_read32(bEnd + 0xc);
        local_260 = XXH32_round(local_260,UVar2);
        bEnd = bEnd + 0x10;
      } while (bEnd <= pBVar3 + -0x10);
      state_in->v1 = v3;
      state_in->v2 = v4;
      state_in->v3 = local_25c;
      state_in->v4 = local_260;
    }
    if (bEnd < pBVar3) {
      XXH_memcpy(state_in->mem32,bEnd,(long)pBVar3 - (long)bEnd);
      state_in->memsize = (int)pBVar3 - (int)bEnd;
    }
  }
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_update (XXH32_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH32_update_endian(state_in, input, len, XXH_bigEndian);
}